

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O1

double __thiscall
Problem_CGBG_FF::ComputeLocalUtility
          (Problem_CGBG_FF *this,Index hI,Scope *tupleOfAgents,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *actions,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *types)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  undefined1 in_XMM3 [16];
  vector<double,_std::allocator<double>_> p_oVec_fl;
  vector<unsigned_int,_std::allocator<unsigned_int>_> oVec_hI;
  allocator_type local_89;
  double local_88;
  double local_80;
  vector<double,_std::allocator<double>_> local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  double local_48;
  double local_40;
  undefined1 local_38 [16];
  
  sVar3 = ComputeNumberOfAgentsPresentAtHouse(this,hI,actions);
  FilterObservationsForHouse(&local_60,this,hI,tupleOfAgents,types);
  std::vector<double,_std::allocator<double>_>::vector(&local_78,this->_m_nrFireLevels,&local_89);
  if (this->_m_nrFireLevels == 0) {
    local_80 = 0.0;
  }
  else {
    uVar7 = 0;
    local_80 = 0.0;
    do {
      dVar8 = 1.0;
      if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        dVar8 = 1.0;
        uVar4 = 0;
        uVar5 = 1;
        do {
          local_88 = dVar8;
          dVar8 = FLObservationProb(this,(Index)uVar7,
                                    local_60.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start[uVar4]);
          dVar8 = local_88 * dVar8;
          bVar2 = uVar5 < (ulong)((long)local_60.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_60.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 2);
          uVar4 = uVar5;
          uVar5 = (ulong)((int)uVar5 + 1);
        } while (bVar2);
      }
      if ((ulong)((long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) <= uVar7) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7
                  );
      }
      auVar11 = vcvtusi2sd_avx512f(in_XMM3,this->_m_nrFireLevels);
      dVar8 = dVar8 * (1.0 / auVar11._0_8_);
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar7] = dVar8;
      local_80 = local_80 + dVar8;
      uVar7 = (ulong)((Index)uVar7 + 1);
    } while (uVar7 < this->_m_nrFireLevels);
  }
  bVar2 = Globals::EqualProbability(local_80,0.0);
  auVar12 = ZEXT864(0) << 0x40;
  dVar8 = 0.0;
  if (!bVar2 && this->_m_nrFireLevels != 0) {
    auVar11 = vcvtusi2sd_avx512f(in_XMM3,sVar3);
    local_48 = auVar11._0_8_;
    uVar7 = 0;
    do {
      auVar11 = auVar12._0_16_;
      if ((ulong)((long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) <= uVar7) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7
                  );
      }
      dVar8 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7];
      iVar6 = (int)uVar7;
      if (iVar6 == 0) {
        auVar9 = SUB6416(ZEXT864(0),0) << 0x40;
      }
      else {
        auVar11 = vcvtusi2sd_avx512f(in_XMM3,iVar6);
        auVar1._8_8_ = 0x8000000000000000;
        auVar1._0_8_ = 0x8000000000000000;
        local_38 = vorpd_avx512vl(auVar11,auVar1);
        local_88 = auVar12._0_8_;
        local_40 = dVar8;
        dVar8 = pow(0.7,local_48);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = local_88;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = dVar8 * (double)local_38._0_8_;
        dVar8 = local_40;
      }
      auVar10._0_8_ = dVar8 / local_80;
      auVar10._8_8_ = 0;
      auVar11 = vfmadd231sd_fma(auVar11,auVar9,auVar10);
      auVar12 = ZEXT1664(auVar11);
      dVar8 = auVar11._0_8_;
      uVar7 = (ulong)(iVar6 + 1);
    } while (uVar7 < this->_m_nrFireLevels);
  }
  local_88 = dVar8;
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return local_88;
}

Assistant:

double Problem_CGBG_FF::ComputeLocalUtility( 
        Index hI, 
        const Scope& tupleOfAgents,
        const vector<Index>& actions,
        const vector<Index>& types
        )
{
#if DEBUGUTILS    
    cout << "ComputeLocalUtility( " 
         << "hI=" << hI 
         << ", tupleOfAgents=" << tupleOfAgents
         << ", actions=" << PrintTools::SoftPrintVector(actions)
         << ", types=" << PrintTools::SoftPrintVector(types)
         << endl;
#endif

    size_t nrAgentsPresent = ComputeNumberOfAgentsPresentAtHouse(hI, actions);
    
    //compute the probabilities over the firelevels of this house, given the joint type
    //and compute 
    //      U^e(jt_e,ja_e) = \sum_s_e P(s_e|jt_e) R^e(s_e,ja_e)
    //(where e corresponds to this house hI)
    //
    //However, in this problem we have some simplying assumptions.
    //E.g., extending the example introduced above, for house 2, we have:
    //      U2(t1t2,a1a2) = \sum_s2 P(s2|t1t2) R(s2|a1a2)
    //
    //Here of course  P(s2|t1t2) =  P(s2,t1t2)/ P(t1t2)
    //
    //However <t1,t2> specify multiple observations, only some of which pertain to house 2,
    //let's rewrite <t1t2> = <h21,h22,hx1,hx2> 
    //(where hxi are to observations of agent i about different houses)
    //
    //  P(s2|h21,h22,hx1,hx2) = P(h21,h22,hx1,hx2|s2) P(s2) / P( h21,h22,hx1,hx2 )
    //                        = P(h21|s2)P(h22|s2)P(s2)P(hx1)P(hx2) / (P(hx1)P(hx2)*\sum_{s2} P(h21|s2)P(h22|s2)P(s2) )
    //                        = P(h21|s2)P(h22|s2)P(s2) / \sum_{s2} P(h21|s2)P(h22|s2)P(s2) 
    //                        = P(s2|h21,h22)
    //

    vector<Problem_CGBG_FF::observation_t> oVec_hI = 
        FilterObservationsForHouse(hI, tupleOfAgents, types);

    double p_oVec = 0.0;
    vector<double> p_oVec_fl(_m_nrFireLevels);
    for(Index fl=0; fl < _m_nrFireLevels; fl++)
    {
        p_oVec_fl.at(fl) = Likelihood(hI, oVec_hI, fl) * Prior(hI, fl);
        p_oVec += p_oVec_fl.at(fl);
        //cout << "\tP(oVec, FL="<<fl<<") = " << p_oVec_fl.at(fl) << endl;        
    }
    //cout << "P(oVec)="<< p_oVec << endl;

    double u_jt_ja = 0.0;

    if(EqualProbability(p_oVec,0.0))
        return(0.0);

    for(Index fl=0; fl < _m_nrFireLevels; fl++)
    {
        double p_fl__oVec = p_oVec_fl.at(fl) / p_oVec;
        double u_fl_ja = GetHouseReward(fl, nrAgentsPresent);
        //cout << "\tp_fl__oVec="<<p_fl__oVec<<" u_fl_ja="<<u_fl_ja<<endl;
        u_jt_ja += p_fl__oVec * u_fl_ja;
    }
#if DEBUGUTILS    
    cout << "u_jt_ja="<<u_jt_ja<<endl;
    if(isnan(u_jt_ja))
        abort();
#endif
    return u_jt_ja;
}